

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_network.cpp
# Opt level: O1

float __thiscall
NeuralNetwork::test(NeuralNetwork *this,
                   vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   *test_xs,vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                            *test_ys)

{
  pointer pvVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  float fVar6;
  Index realMaxRow;
  Index predMaxRow;
  vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  yvecs;
  vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  xvecs;
  void *local_98 [2];
  long local_88;
  void *local_80;
  long local_78;
  vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  local_68;
  vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  local_48;
  
  lVar2 = (long)(test_xs->
                super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(test_xs->
                super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
  if (lVar2 != (long)(test_ys->
                     super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(test_ys->
                     super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start) {
    __assert_fail("test_xs.size() == test_ys.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Everglow123[P]NN/neural_network.cpp"
                  ,0xa0,
                  "float NeuralNetwork::test(std::vector<std::vector<float>> &, std::vector<std::vector<float>> &)"
                 );
  }
  local_48.
  super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
  ::reserve(&local_48,(lVar2 >> 3) * -0x5555555555555555);
  local_68.
  super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
  ::reserve(&local_68,
            ((long)(test_ys->
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(test_ys->
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  local_88 = (long)(test_xs->
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(test_xs->
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
  lVar2 = (local_88 >> 3) * -0x5555555555555555;
  if (0 < local_88) {
    lVar5 = 1;
    if (1 < lVar2) {
      lVar5 = lVar2;
    }
    lVar3 = 8;
    do {
      pvVar1 = (test_xs->
               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_80 = *(void **)((long)pvVar1 + lVar3 + -8);
      local_78 = *(long *)((long)&(pvVar1->super__Vector_base<float,_std::allocator<float>_>).
                                  _M_impl.super__Vector_impl_data + lVar3) - (long)local_80 >> 2;
      if (local_78 < 0) goto LAB_00106529;
      Eigen::PlainObjectBase<Eigen::Matrix<float,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>
                ((PlainObjectBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)local_98,
                 (DenseBase<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                  *)&local_80);
      std::vector<Eigen::Matrix<float,-1,1,0,-1,1>,std::allocator<Eigen::Matrix<float,-1,1,0,-1,1>>>
      ::emplace_back<Eigen::Matrix<float,_1,1,0,_1,1>>
                ((vector<Eigen::Matrix<float,_1,1,0,_1,1>,std::allocator<Eigen::Matrix<float,_1,1,0,_1,1>>>
                  *)&local_48,(Matrix<float,__1,_1,_0,__1,_1> *)local_98);
      free(local_98[0]);
      lVar3 = lVar3 + 0x18;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  if (0 < local_88) {
    lVar5 = 1;
    if (1 < lVar2) {
      lVar5 = lVar2;
    }
    lVar3 = 8;
    do {
      pvVar1 = (test_ys->
               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_80 = *(void **)((long)pvVar1 + lVar3 + -8);
      local_78 = *(long *)((long)&(pvVar1->super__Vector_base<float,_std::allocator<float>_>).
                                  _M_impl.super__Vector_impl_data + lVar3) - (long)local_80 >> 2;
      if (local_78 < 0) {
LAB_00106529:
        __assert_fail("vecSize >= 0","/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xa6,
                      "Eigen::MapBase<Eigen::Map<Eigen::Matrix<float, -1, 1>>, 0>::MapBase(PointerType, Index) [Derived = Eigen::Map<Eigen::Matrix<float, -1, 1>>, Level = 0]"
                     );
      }
      Eigen::PlainObjectBase<Eigen::Matrix<float,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>
                ((PlainObjectBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)local_98,
                 (DenseBase<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                  *)&local_80);
      std::vector<Eigen::Matrix<float,-1,1,0,-1,1>,std::allocator<Eigen::Matrix<float,-1,1,0,-1,1>>>
      ::emplace_back<Eigen::Matrix<float,_1,1,0,_1,1>>
                ((vector<Eigen::Matrix<float,_1,1,0,_1,1>,std::allocator<Eigen::Matrix<float,_1,1,0,_1,1>>>
                  *)&local_68,(Matrix<float,__1,_1,_0,__1,_1> *)local_98);
      free(local_98[0]);
      lVar3 = lVar3 + 0x18;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  if (local_88 < 1) {
    fVar6 = 0.0;
  }
  else {
    lVar5 = 1;
    if (1 < lVar2) {
      lVar5 = lVar2;
    }
    lVar4 = 0;
    lVar3 = 0;
    do {
      forwardPropagation(this,(VectorXf *)
                              ((long)&((local_48.
                                        super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>)
                                      .m_storage.m_data + lVar4));
      Eigen::DenseBase<Eigen::Matrix<float,-1,1,0,-1,1>>::maxCoeff<0,long>
                ((DenseBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)
                 &(this->layers_).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1].output,(long *)&local_80);
      Eigen::DenseBase<Eigen::Matrix<float,-1,1,0,-1,1>>::maxCoeff<0,long>
                ((DenseBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)
                 ((long)&((local_68.
                           super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.
                         m_data + lVar4),(long *)local_98);
      lVar3 = lVar3 + (ulong)(local_80 == local_98[0]);
      lVar4 = lVar4 + 0x10;
    } while (lVar5 * 0x10 != lVar4);
    fVar6 = (float)lVar3;
  }
  std::
  vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
  ::~vector(&local_68);
  std::
  vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
  ::~vector(&local_48);
  return fVar6 / (float)lVar2;
}

Assistant:

float NeuralNetwork::test(std::vector<std::vector<float>>& test_xs,
                          std::vector<std::vector<float>>& test_ys) {
    using namespace std;
    using namespace Eigen;
    assert(test_xs.size() == test_ys.size());
    vector<VectorXf> xvecs;
    xvecs.reserve(test_xs.size());
    vector<VectorXf> yvecs;
    yvecs.reserve(test_ys.size());

    ssize_t testDataSize = test_xs.size();
    ssize_t correctCount = 0;
    for (int i = 0; i < testDataSize; ++i) {
        xvecs.push_back(NeuralNetwork::stdVecToEigenVec(test_xs[i]));
    }
    for (int i = 0; i < testDataSize; ++i) {
        yvecs.push_back(NeuralNetwork::stdVecToEigenVec(test_ys[i]));
    }

    for (int i = 0; i < testDataSize; ++i) {
        this->forwardPropagation(xvecs[i]);
        VectorXf::Index predMaxRow, realMaxRow;
        this->layers_.back().output.maxCoeff(&predMaxRow);
        yvecs[i].maxCoeff(&realMaxRow);
        if (predMaxRow == realMaxRow) {
            correctCount++;
        }
    }
    // cout << correctCount << endl;
    return float(correctCount) / float(testDataSize);
}